

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_suite.cpp
# Opt level: O2

void transform_suite::test_add_const(void)

{
  undefined4 local_34;
  
  local_34 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("(meta::to_index<constlist, bool>::value)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/meta_suite.cpp"
             ,0x1c,"void transform_suite::test_add_const()",
             &std::integral_constant<unsigned_long,_2UL>::value,&local_34);
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("(meta::to_index<constlist, const bool>::value)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/meta_suite.cpp"
             ,0x1d,"void transform_suite::test_add_const()",
             &std::integral_constant<unsigned_long,_0UL>::value,&local_34);
  local_34 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("(meta::to_index<constlist, int>::value)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/meta_suite.cpp"
             ,0x1e,"void transform_suite::test_add_const()",
             &std::integral_constant<unsigned_long,_2UL>::value,&local_34);
  local_34 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("(meta::to_index<constlist, const int>::value)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/meta_suite.cpp"
             ,0x1f,"void transform_suite::test_add_const()",
             &std::integral_constant<unsigned_long,_1UL>::value,&local_34);
  return;
}

Assistant:

void test_add_const()
{
    using typelist = meta::list<bool, int>;
    using constlist = meta::transform<typelist, std::add_const>;
    TRIAL_PROTOCOL_TEST_EQUAL((meta::to_index<constlist, bool>::value), 2);
    TRIAL_PROTOCOL_TEST_EQUAL((meta::to_index<constlist, const bool>::value), 0);
    TRIAL_PROTOCOL_TEST_EQUAL((meta::to_index<constlist, int>::value), 2);
    TRIAL_PROTOCOL_TEST_EQUAL((meta::to_index<constlist, const int>::value), 1);
}